

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O1

int evutil_hex_char_to_int_(char c)

{
  int iVar1;
  
  iVar1 = -1;
  if ((byte)(c - 0x30U) < 0x37) {
    iVar1 = *(int *)(&DAT_0022dfb0 + (ulong)(byte)(c - 0x30U) * 4);
  }
  return iVar1;
}

Assistant:

int
evutil_hex_char_to_int_(char c)
{
	switch(c)
	{
		case '0': return 0;
		case '1': return 1;
		case '2': return 2;
		case '3': return 3;
		case '4': return 4;
		case '5': return 5;
		case '6': return 6;
		case '7': return 7;
		case '8': return 8;
		case '9': return 9;
		case 'A': case 'a': return 10;
		case 'B': case 'b': return 11;
		case 'C': case 'c': return 12;
		case 'D': case 'd': return 13;
		case 'E': case 'e': return 14;
		case 'F': case 'f': return 15;
	}
	return -1;
}